

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

ALenum check_al_error_events(void)

{
  uint32 x;
  ALenum *pAVar1;
  
  if (current_context == (ContextWrapper *)0x0) {
    x = 0;
  }
  else {
    x = (*REAL_alGetError)();
    if (x != 0) {
      pAVar1 = &null_context_errorlatch;
      if (current_context != (ContextWrapper *)0x0) {
        pAVar1 = &current_context->errorlatch;
      }
      writele32(1);
      writele32(x);
      if (*pAVar1 == 0) {
        *pAVar1 = x;
      }
    }
  }
  return x;
}

Assistant:

static ALenum check_al_error_events(void)
{
    if (!current_context) return AL_NO_ERROR;  // !!! FIXME: OpenAL-Soft returns AL_INVALID_OPERATION if no context is current.
    const ALenum alerr = REAL_alGetError();
    if (alerr != AL_NO_ERROR) {
        ALenum *errorlatch = current_context ? &current_context->errorlatch : &null_context_errorlatch;
        IO_EVENTENUM(ALEE_ALERROR_TRIGGERED);
        IO_ENUM(alerr);
        if (*errorlatch == AL_NO_ERROR) {
            *errorlatch = alerr;
        }
    }
    return alerr;
}